

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

TestSpec * Catch::parseTestSpec(TestSpec *__return_storage_ptr__,string *arg)

{
  ITagAliasRegistry *tagAliases;
  TestSpecParser *this;
  TestSpecParser local_100;
  string *local_18;
  string *arg_local;
  
  local_18 = arg;
  arg_local = (string *)__return_storage_ptr__;
  tagAliases = ITagAliasRegistry::get();
  TestSpecParser::TestSpecParser(&local_100,tagAliases);
  this = TestSpecParser::parse(&local_100,local_18);
  TestSpecParser::testSpec(__return_storage_ptr__,this);
  TestSpecParser::~TestSpecParser(&local_100);
  return __return_storage_ptr__;
}

Assistant:

TestSpec parseTestSpec(std::string const &arg) {
    return TestSpecParser(ITagAliasRegistry::get()).parse(arg).testSpec();
  }